

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.h
# Opt level: O0

unsigned_short * __thiscall
xray_re::xr_flexbuf::copy<unsigned_short>
          (xr_flexbuf *this,unsigned_short *source,unsigned_short *target,size_t size)

{
  size_t size_local;
  unsigned_short *target_local;
  unsigned_short *source_local;
  xr_flexbuf *this_local;
  
  std::uninitialized_copy<unsigned_short_const*,unsigned_short*>(source,source + size,target);
  return target;
}

Assistant:

inline T* xr_flexbuf::copy(const T* source, T* target, size_t size) const
{
#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1600
	stdext::unchecked_uninitialized_copy(source, source + size, target);
#else
	std::uninitialized_copy(source, source + size, target);
#endif
	return target;
}